

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::flattenUnknowns(SVInt *this)

{
  ulong *puVar1;
  uint64_t *puVar2;
  bitwidth_t bVar3;
  uint uVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  ulong uVar5;
  ulong uVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 *__src;
  
  if ((this->super_SVIntStorage).unknownFlag != true) {
    return;
  }
  uVar4 = (this->super_SVIntStorage).bitWidth + 0x3f;
  if (0x3f < uVar4) {
    uVar5 = (ulong)(uVar4 >> 3 & 0xfffffff8);
    uVar6 = 0;
    do {
      puVar2 = (this->super_SVIntStorage).field_0.pVal;
      puVar1 = (ulong *)((long)puVar2 + uVar6);
      *puVar1 = *puVar1 & ~*(ulong *)((long)puVar2 + uVar5 + uVar6);
      *(undefined8 *)((long)(this->super_SVIntStorage).field_0.pVal + uVar6 + uVar5) = 0;
      uVar6 = uVar6 + 8;
    } while (uVar5 != uVar6);
    checkUnknown(this);
    return;
  }
  if ((this->super_SVIntStorage).unknownFlag != true) {
    return;
  }
  uVar4 = (this->super_SVIntStorage).bitWidth;
  bVar3 = countLeadingZerosSlowCase(this);
  if (bVar3 < uVar4) {
    return;
  }
  (this->super_SVIntStorage).unknownFlag = false;
  uVar4 = uVar4 + 0x3f >> 6;
  if (uVar4 == 1) {
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    __dest = *__src;
  }
  else {
    uVar5 = (ulong)(uVar4 << 3);
    __dest.pVal = (uint64_t *)operator_new__(uVar5);
    __src = (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)(this->super_SVIntStorage).field_0.pVal;
    memcpy(__dest.pVal,__src,uVar5);
    if (__src == (anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)0x0) goto LAB_00663544;
  }
  operator_delete__(__src);
LAB_00663544:
  (this->super_SVIntStorage).field_0 = __dest;
  return;
}

Assistant:

void SVInt::flattenUnknowns() {
    if (!unknownFlag)
        return;

    uint32_t words = getNumWords(bitWidth, false);
    for (uint32_t i = 0; i < words; i++) {
        pVal[i] &= ~pVal[i + words];
        pVal[i + words] = 0;
    }

    checkUnknown();
}